

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Glucose::Solver::garbageCollect(Solver *this)

{
  uint32_t uVar1;
  long *in_RDI;
  ClauseAllocator to;
  undefined4 in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  RegionAllocator<unsigned_int> local_20;
  
  RegionAllocator<unsigned_int>::size((RegionAllocator<unsigned_int> *)(in_RDI + 0x68));
  RegionAllocator<unsigned_int>::wasted((RegionAllocator<unsigned_int> *)(in_RDI + 0x68));
  ClauseAllocator::ClauseAllocator
            ((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c);
  (**(code **)(*in_RDI + 0x78))(in_RDI,&local_20);
  if (1 < (int)in_RDI[5]) {
    uVar1 = RegionAllocator<unsigned_int>::size((RegionAllocator<unsigned_int> *)(in_RDI + 0x68));
    in_stack_ffffffffffffffa4 = uVar1 << 2;
    uVar1 = RegionAllocator<unsigned_int>::size(&local_20);
    printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",
           (ulong)in_stack_ffffffffffffffa4,(ulong)(uVar1 << 2));
  }
  ClauseAllocator::moveTo
            ((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (ClauseAllocator *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  ClauseAllocator::~ClauseAllocator((ClauseAllocator *)0x121132);
  return;
}

Assistant:

void Solver::garbageCollect() {
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted());
    relocAll(to);
    if(verbosity >= 2)
        printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",
               ca.size() * ClauseAllocator::Unit_Size, to.size() * ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}